

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O3

void __thiscall Rml::FontEffectBlurInstancer::FontEffectBlurInstancer(FontEffectBlurInstancer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  PropertyId PVar5;
  PropertyDefinition *pPVar6;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  FontEffectInstancer::FontEffectInstancer(&this->super_FontEffectInstancer);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer =
       (_func_int **)&PTR__FontEffectBlurInstancer_00330b40;
  this->id_width = Invalid;
  this->id_color = Invalid;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"width","");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"1px","");
  pPVar6 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_90,&local_b0,true);
  paVar3 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"length","");
  paVar4 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar6);
  this->id_width = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"color","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"white","");
  pPVar6 = FontEffectInstancer::RegisterProperty
                     (&this->super_FontEffectInstancer,&local_90,&local_b0,false);
  local_50._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"color","");
  local_70._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pPVar6 = PropertyDefinition::AddParser(pPVar6,&local_50,&local_70);
  PVar5 = PropertyDefinition::GetId(pPVar6);
  this->id_color = PVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"font-effect","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"width, color","");
  FontEffectInstancer::RegisterShorthand
            (&this->super_FontEffectInstancer,&local_90,&local_b0,FallThrough);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FontEffectBlurInstancer::FontEffectBlurInstancer() : id_width(PropertyId::Invalid), id_color(PropertyId::Invalid)
{
	id_width = RegisterProperty("width", "1px", true).AddParser("length").GetId();
	id_color = RegisterProperty("color", "white", false).AddParser("color").GetId();
	RegisterShorthand("font-effect", "width, color", ShorthandType::FallThrough);
}